

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int fast_expansion_sum_zeroelim(int elen,double *e,int flen,double *f,double *h)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double local_88;
  double fnow;
  double enow;
  uint local_70;
  int hindex;
  int findex;
  int eindex;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double hh;
  double Qnew;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  dVar2 = *e;
  Qnew = *f;
  bVar1 = dVar2 < Qnew != -dVar2 < Qnew;
  if (bVar1) {
    local_88 = f[1];
    fnow = dVar2;
  }
  else {
    local_88 = Qnew;
    fnow = e[1];
    Qnew = dVar2;
  }
  hindex = (int)!bVar1;
  local_70 = (uint)bVar1;
  enow._4_4_ = 0;
  if ((hindex < elen) && ((int)local_70 < flen)) {
    if (fnow < local_88 == -fnow < local_88) {
      hh = fnow + Qnew;
      dVar2 = hh - fnow;
      hindex = hindex + 1;
      fnow = e[hindex];
    }
    else {
      hh = local_88 + Qnew;
      dVar2 = hh - local_88;
      local_70 = local_70 + 1;
      local_88 = f[(int)local_70];
    }
    bvirt = Qnew - dVar2;
    Qnew = hh;
    if ((bvirt != 0.0) || (NAN(bvirt))) {
      *h = bvirt;
      enow._4_4_ = 1;
    }
    while (hindex < elen && (int)local_70 < flen) {
      if (fnow < local_88 == -fnow < local_88) {
        hh = Qnew + fnow;
        bvirt = (Qnew - (hh - (hh - Qnew))) + (fnow - (hh - Qnew));
        hindex = hindex + 1;
        fnow = e[hindex];
      }
      else {
        hh = Qnew + local_88;
        bvirt = (Qnew - (hh - (hh - Qnew))) + (local_88 - (hh - Qnew));
        local_70 = local_70 + 1;
        local_88 = f[(int)local_70];
      }
      Qnew = hh;
      if ((bvirt != 0.0) || (NAN(bvirt))) {
        h[enow._4_4_] = bvirt;
        enow._4_4_ = enow._4_4_ + 1;
      }
    }
  }
  while (hindex < elen) {
    dVar2 = Qnew + fnow;
    dVar3 = (Qnew - (dVar2 - (dVar2 - Qnew))) + (fnow - (dVar2 - Qnew));
    hindex = hindex + 1;
    fnow = e[hindex];
    Qnew = dVar2;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      h[enow._4_4_] = dVar3;
      enow._4_4_ = enow._4_4_ + 1;
    }
  }
  while ((int)local_70 < flen) {
    dVar2 = Qnew + local_88;
    dVar3 = (Qnew - (dVar2 - (dVar2 - Qnew))) + (local_88 - (dVar2 - Qnew));
    local_70 = local_70 + 1;
    local_88 = f[(int)local_70];
    Qnew = dVar2;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      h[enow._4_4_] = dVar3;
      enow._4_4_ = enow._4_4_ + 1;
    }
  }
  if (((Qnew != 0.0) || (NAN(Qnew))) || (enow._4_4_ == 0)) {
    h[enow._4_4_] = Qnew;
    enow._4_4_ = enow._4_4_ + 1;
  }
  return enow._4_4_;
}

Assistant:

int fast_expansion_sum_zeroelim(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q;
  INEXACT REAL Qnew;
  INEXACT REAL hh;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    Q = enow;
    enow = e[++eindex];
  } else {
    Q = fnow;
    fnow = f[++findex];
  }
  hindex = 0;
  if ((eindex < elen) && (findex < flen)) {
    if ((fnow > enow) == (fnow > -enow)) {
      Fast_Two_Sum(enow, Q, Qnew, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, Q, Qnew, hh);
      fnow = f[++findex];
    }
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
    while ((eindex < elen) && (findex < flen)) {
      if ((fnow > enow) == (fnow > -enow)) {
        Two_Sum(Q, enow, Qnew, hh);
        enow = e[++eindex];
      } else {
        Two_Sum(Q, fnow, Qnew, hh);
        fnow = f[++findex];
      }
      Q = Qnew;
      if (hh != 0.0) {
        h[hindex++] = hh;
      }
    }
  }
  while (eindex < elen) {
    Two_Sum(Q, enow, Qnew, hh);
    enow = e[++eindex];
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  while (findex < flen) {
    Two_Sum(Q, fnow, Qnew, hh);
    fnow = f[++findex];
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}